

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

void getn(stbi *s,stbi_uc *buffer,int n)

{
  if ((FILE *)s->img_file != (FILE *)0x0) {
    fread(buffer,1,(long)n,(FILE *)s->img_file);
    return;
  }
  memcpy(buffer,s->img_buffer,(long)n);
  s->img_buffer = s->img_buffer + n;
  return;
}

Assistant:

static void getn(stbi *s, stbi_uc *buffer, int n)
{
#ifndef STBI_NO_STDIO
   if (s->img_file) {
      fread(buffer, 1, n, s->img_file);
      return;
   }
#endif
   memcpy(buffer, s->img_buffer, n);
   s->img_buffer += n;
}